

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transfer_Control_Request_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Transfer_Control_Request_PDU::Transfer_Control_Request_PDU
          (Transfer_Control_Request_PDU *this,KUINT32 ReqID,RequiredReliabilityService RRS,
          TransferType TT,EntityIdentifier *TrnsEntID)

{
  EntityIdentifier *TrnsEntID_local;
  TransferType TT_local;
  RequiredReliabilityService RRS_local;
  KUINT32 ReqID_local;
  Transfer_Control_Request_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transfer_Control_Request_PDU_0032b980;
  this->m_ui32ReqID = ReqID;
  this->m_ui8ReqRelSrv = (KUINT8)RRS;
  this->m_ui8TrnTyp = (KUINT8)TT;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TrnsEntID,TrnsEntID);
  this->m_ui32NumRecSets = 0;
  std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::vector
            (&this->m_vRecs);
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '#';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  return;
}

Assistant:

Transfer_Control_Request_PDU::Transfer_Control_Request_PDU( KUINT32 ReqID, RequiredReliabilityService RRS, TransferType TT, const EntityIdentifier & TrnsEntID ) :
    m_ui32ReqID( ReqID ),
    m_ui8ReqRelSrv( RRS ),
    m_ui8TrnTyp( TT ),
    m_TrnsEntID( TrnsEntID ),
    m_ui32NumRecSets( 0 )
{
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = TransferControl_PDU_Type;
    m_ui16PDULength = TRANSFER_CONTROL_REQUEST_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}